

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testAttrHandler(string *tempdir)

{
  int iVar1;
  exr_result_t eVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *poVar5;
  ostream *this;
  exr_result_t _test_rv_31;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  exr_result_t _test_rv_25;
  exr_result_t _test_rv_24;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_attribute_t *bar;
  exr_attribute_t *foo;
  exr_context_t f;
  uint8_t data4 [4];
  void *packed;
  int32_t nsz;
  exr_result_t _test_rv;
  char *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  uint uVar6;
  ostream *in_stack_fffffffffffffdb8;
  exr_attr_opaquedata_t *in_stack_fffffffffffffdc0;
  ostream *in_stack_fffffffffffffdc8;
  exr_attr_opaquedata_t *in_stack_fffffffffffffdd0;
  ostream *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffe30;
  long local_38;
  long local_30;
  exr_context_t local_28;
  undefined4 local_1c;
  long local_18;
  int local_10;
  int local_c;
  
  uVar6 = (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  local_c = exr_register_attr_type_handler(0,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (local_c != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  local_10 = -1;
  local_1c = 0xefbeadde;
  local_28 = createDummyFile(in_stack_fffffffffffffe30);
  local_30 = 0;
  local_38 = 0;
  iVar1 = exr_attr_declare_by_type(local_28,0,"foo","mytype",&local_30);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (local_30 == 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(long *)(*(long *)(local_30 + 0x18) + 0x20) != 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_unpack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_unpack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_unpack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_register_attr_type_handler(local_28,0,test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_register_attr_type_handler(local_28,"",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_register_attr_type_handler
                    (local_28,"reallongreallongreallonglongname",test_unpack,test_pack,
                     test_hdlr_destroy);
  if (iVar1 != 0xc) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0xc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_register_attr_type_handler(local_28,"box2i",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_register_attr_type_handler(local_28,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_register_attr_type_handler(local_28,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_30 + 0x18) + 0x20) != test_unpack) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_30 + 0x18) + 0x28) != test_pack) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_30 + 0x18) + 0x30) != test_hdlr_destroy) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  iVar1 = exr_attr_declare_by_type(local_28,0,"bar","mytype",&local_38);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (local_38 == 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x20) != test_unpack) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x28) != test_pack) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x30) != test_hdlr_destroy) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_unpacked
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_unpack_fail = 1;
  eVar2 = exr_attr_opaquedata_unpack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_unpack_fail = 0;
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (local_10 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (local_18 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_pack_fail = 1;
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_pack_fail = 0;
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x20) != test_unpack) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x28) != test_pack) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x30) != test_hdlr_destroy) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(long *)(*(long *)(local_38 + 0x18) + 0x18) != 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_unpack_fail = 1;
  eVar2 = exr_attr_opaquedata_unpack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0x17) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x17);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0x17);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_unpack_fail = 0;
  eVar2 = exr_attr_opaquedata_unpack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(long *)(*(long *)(local_38 + 0x18) + 0x18) == 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  set_malloc_fail_on(1);
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  set_malloc_fail_off();
  if (eVar2 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  if (*(long *)(*(long *)(local_38 + 0x18) + 0x18) == 0) {
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_packed
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  eVar2 = exr_attr_opaquedata_set_unpacked
                    ((exr_context_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,uVar6);
  if (eVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    in_stack_fffffffffffffdd8 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(in_stack_fffffffffffffdd8,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_pack_fail = 1;
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0x17) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    in_stack_fffffffffffffdc8 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(in_stack_fffffffffffffdc8,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x17);
    in_stack_fffffffffffffdd0 = (exr_attr_opaquedata_t *)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0x17);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffdd0,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_pack_fail = 2;
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  if (eVar2 != 0x17) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    in_stack_fffffffffffffdb8 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar3 = std::operator<<(in_stack_fffffffffffffdb8,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x17);
    in_stack_fffffffffffffdc0 = (exr_attr_opaquedata_t *)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(0x17);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffdc0,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   in_stack_fffffffffffffda8);
  }
  s_pack_fail = 0;
  set_malloc_fail_on(1);
  eVar2 = exr_attr_opaquedata_pack
                    ((exr_context_t)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     (int32_t *)in_stack_fffffffffffffdc8,(void **)in_stack_fffffffffffffdc0);
  set_malloc_fail_off();
  if (eVar2 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar2);
    poVar5 = std::operator<<(poVar3,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    this = std::operator<<(poVar5,pcVar4);
    uVar6 = (uint)((ulong)poVar5 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,uVar6,
                   (char *)poVar3);
  }
  exr_finish(&local_28);
  return;
}

Assistant:

void
testAttrHandler (const std::string& tempdir)
{
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_register_attr_type_handler (
            NULL, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));

    int32_t nsz = -1;
    void*   packed;
    uint8_t data4[] = {0xDE, 0xAD, 0xBE, 0xEF};

    exr_context_t    f   = createDummyFile ("<attr_handler>");
    exr_attribute_t *foo = NULL, *bar = NULL;
    EXRCORE_TEST_RVAL (exr_attr_declare_by_type (f, 0, "foo", "mytype", &foo));
    EXRCORE_TEST (foo != NULL);
    EXRCORE_TEST (foo->opaque->unpack_func_ptr == NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_unpack (NULL, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_unpack (f, NULL, &nsz, &packed));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, NULL, &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_register_attr_type_handler (
            f,
            "reallongreallongreallonglongname",
            &test_unpack,
            &test_pack,
            &test_hdlr_destroy));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "box2i", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL (exr_register_attr_type_handler (
        f, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST (foo->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (foo->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (foo->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);

    EXRCORE_TEST_RVAL (exr_attr_declare_by_type (f, 0, "bar", "mytype", &bar));
    EXRCORE_TEST (bar != NULL);
    EXRCORE_TEST (bar->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (bar->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4));
    // make sure it keeps the unpacked value
    s_unpack_fail = 1;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed));
    s_unpack_fail = 0;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_pack (NULL, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_pack (f, NULL, &nsz, &packed));
    EXRCORE_TEST (nsz == 0);
    EXRCORE_TEST (packed == NULL);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    // make sure it keeps the old value
    s_pack_fail = 1;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 0;

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_set_packed (NULL, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_set_packed (f, NULL, data4, 4));
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, -1));
    EXRCORE_TEST (bar->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (bar->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);
    EXRCORE_TEST (bar->opaque->unpacked_data == NULL);

    s_unpack_fail = 1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed));
    s_unpack_fail = 0;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed));
    EXRCORE_TEST (bar->opaque->unpacked_data != NULL);

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    // make sure state didn't change
    EXRCORE_TEST (bar->opaque->unpacked_data != NULL);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4));
    s_pack_fail = 1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 2;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 0;
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));

    exr_finish (&f);
}